

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvhsah.hpp
# Opt level: O0

void __thiscall BVH::BVH(BVH *this,vector<Object_*,_std::allocator<Object_*>_> *list)

{
  bool bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  const_iterator __x;
  reference ppOVar4;
  vector<Object_*,_std::allocator<Object_*>_> *in_RSI;
  vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  *in_RDI;
  Object *o;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Object_*,_std::allocator<Object_*>_> *__range1;
  treenode **in_stack_000001f0;
  vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  *in_stack_000001f8;
  BVH *in_stack_00000200;
  value_type *in_stack_ffffffffffffff78;
  pointer *args;
  ConsoleLogger *in_stack_ffffffffffffff90;
  pair<Primitive_*,_Object_*> local_58;
  Object *local_48;
  Object **local_40;
  
  Accelarator::Accelarator((Accelarator *)in_RDI);
  (in_RDI->
  super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_hit_001e78a8;
  (in_RDI->
  super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args = &(in_RDI->
          super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  ::vector((vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
            *)0x10f78b);
  std::vector<Object_*,_std::allocator<Object_*>_>::size(in_RSI);
  github111116::ConsoleLogger::log<char[20],unsigned_long,char[8]>
            (in_stack_ffffffffffffff90,(char (*) [20])args,(unsigned_long *)in_RDI,
             (char (*) [8])in_stack_ffffffffffffff78);
  sVar2 = std::vector<Object_*,_std::allocator<Object_*>_>::size(in_RSI);
  if (sVar2 == 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "BVH: Object list empty!";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  __x = std::vector<Object_*,_std::allocator<Object_*>_>::begin
                  ((vector<Object_*,_std::allocator<Object_*>_> *)in_stack_ffffffffffffff78);
  local_40 = (Object **)
             std::vector<Object_*,_std::allocator<Object_*>_>::end
                       ((vector<Object_*,_std::allocator<Object_*>_> *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    ppOVar4 = __gnu_cxx::
              __normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
              ::operator*((__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                           *)&stack0xffffffffffffffc8);
    local_48 = *ppOVar4;
    in_stack_ffffffffffffff78 =
         (value_type *)
         &(in_RDI->
          super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::pair<Primitive_*,_Object_*>::pair<Primitive_*&,_Object_*&,_true>
              (&local_58,&local_48->primitive,&local_48);
    std::
    vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>::
    push_back(in_RDI,in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
    ::operator++((__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  std::vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  ::vector((vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
            *)in_RSI,
           (vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
            *)__x._M_current);
  build(in_stack_00000200,in_stack_000001f8,in_stack_000001f0);
  std::vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  ::~vector((vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
             *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

BVH(const std::vector<Object*>& list) {
		console.log("building SAH BVH of", list.size(), "objects");
		if (list.size() == 0) throw "BVH: Object list empty!";
		for (Object* o: list) {
			this->list.push_back({o->primitive, o});
		}
		build(this->list, root);
		// printSA(root);
	}